

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  size_t i;
  ArrayPtr<const_unsigned_char> *pAVar2;
  HttpOutputStream *pHVar3;
  Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_1;
  size_t size;
  undefined4 in_register_00000034;
  ArrayPtr<const_unsigned_char> AVar4;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> local_e0;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_d0;
  undefined1 local_c0 [8];
  Promise<void> promise;
  uchar *local_a8;
  size_t local_a0;
  ArrayPtr<const_unsigned_char> local_98;
  undefined1 local_78 [8];
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  undefined1 local_40 [8];
  String header;
  HttpChunkedEntityWriter *this_local;
  ArrayPtr<const_unsigned_char> buffer_local;
  
  header.content.disposer = (ArrayDisposer *)CONCAT44(in_register_00000034,__fd);
  this_local = (HttpChunkedEntityWriter *)__buf;
  buffer_local.ptr = (uchar *)__n;
  buffer_local.size_ = (size_t)this;
  bVar1 = ArrayPtr<const_unsigned_char>::operator==
                    ((ArrayPtr<const_unsigned_char> *)&this_local,(void *)0x0);
  if (bVar1) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    i = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
    hex((CappedArray<char,_17UL> *)&parts.disposer,i);
    str<kj::CappedArray<char,17ul>,char_const(&)[3]>
              ((String *)local_40,(kj *)&parts.disposer,(CappedArray<char,_17UL> *)0x93c086,
               (char (*) [3])__n);
    heapArray<kj::ArrayPtr<unsigned_char_const>>
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78,(kj *)0x3,size);
    _local_a8 = String::asBytes((String *)local_40);
    local_98 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&stack0xffffffffffffff58);
    pAVar2 = Array<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78,0);
    *pAVar2 = local_98;
    pAVar2 = Array<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78,1);
    pAVar2->ptr = (uchar *)this_local;
    pAVar2->size_ = (size_t)buffer_local.ptr;
    AVar4 = operator___kjb<kj::_::ByteLiteral<3UL>__13,_10__>();
    promise.super_PromiseBase.node.ptr = (PromiseBase)AVar4.ptr;
    pAVar2 = Array<kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78,2);
    pAVar2->ptr = (uchar *)promise.super_PromiseBase.node.ptr;
    pAVar2->size_ = AVar4.size_;
    pHVar3 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    local_e0 = Array<kj::ArrayPtr<const_unsigned_char>_>::asPtr
                         ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78);
    local_d0 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_e0);
    pieces.size_ = (size_t)local_d0.ptr;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar3;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_c0,pieces);
    attachments_1 = (Array<kj::ArrayPtr<const_unsigned_char>_> *)mv<kj::String>((String *)local_40);
    mv<kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)local_c0,attachments_1);
    Promise<void>::~Promise((Promise<void> *)local_c0);
    Array<kj::ArrayPtr<const_unsigned_char>_>::~Array
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)local_78);
    String::~String((String *)local_40);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    if (buffer == nullptr) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(buffer.size()), "\r\n");
    auto parts = kj::heapArray<ArrayPtr<const byte>>(3);
    parts[0] = header.asBytes();
    parts[1] = buffer;
    parts[2] = "\r\n"_kjb;

    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }